

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_binary_packed_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DeltaBinaryPackedDecoder::Read
          (DeltaBinaryPackedDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,
          idx_t result_offset)

{
  type tVar1;
  ColumnReader *pCVar2;
  ResizeableBuffer *this_00;
  Allocator *allocator;
  idx_t iVar3;
  idx_t batch_size;
  pointer pDVar4;
  runtime_error *this_01;
  
  batch_size = ColumnReader::GetValidCount(this->reader,defines,read_count,result_offset);
  pCVar2 = this->reader;
  this_00 = this->decoded_data_buffer;
  allocator = pCVar2->reader->allocator;
  iVar3 = this_00->alloc_len;
  (this_00->super_ByteBuffer).ptr = (this_00->allocated_data).pointer;
  (this_00->super_ByteBuffer).len = iVar3;
  tVar1 = pCVar2->column_schema->parquet_type;
  if (tVar1 == INT64) {
    ResizeableBuffer::resize(this_00,allocator,batch_size << 3);
    pDVar4 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::
             operator->(&this->dbp_decoder);
    DbpDecoder::GetBatch<long>(pDVar4,(this->decoded_data_buffer->super_ByteBuffer).ptr,batch_size);
  }
  else {
    if (tVar1 != INT32) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_01,"DELTA_BINARY_PACKED should only be INT32 or INT64");
      __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    ResizeableBuffer::resize(this_00,allocator,batch_size << 2);
    pDVar4 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::
             operator->(&this->dbp_decoder);
    DbpDecoder::GetBatch<int>(pDVar4,(this->decoded_data_buffer->super_ByteBuffer).ptr,batch_size);
  }
  (*this->reader->_vptr_ColumnReader[0xe])
            (this->reader,this->decoded_data_buffer,defines,read_count,result_offset,result);
  return;
}

Assistant:

void DeltaBinaryPackedDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);

	auto &allocator = reader.reader.allocator;
	decoded_data_buffer.reset();
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::INT32:
		decoded_data_buffer.resize(allocator, sizeof(int32_t) * (valid_count));
		dbp_decoder->GetBatch<int32_t>(decoded_data_buffer.ptr, valid_count);
		break;
	case duckdb_parquet::Type::INT64:
		decoded_data_buffer.resize(allocator, sizeof(int64_t) * (valid_count));
		dbp_decoder->GetBatch<int64_t>(decoded_data_buffer.ptr, valid_count);
		break;

	default:
		throw std::runtime_error("DELTA_BINARY_PACKED should only be INT32 or INT64");
	}
	// Plain() will put NULLs in the right place
	reader.Plain(decoded_data_buffer, defines, read_count, result_offset, result);
}